

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void DivisionHelper<char,unsigned_int,2>::
     DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *t,uint *u,char *result)

{
  uint uVar1;
  char cVar2;
  
  uVar1 = *u;
  if (uVar1 != 0) {
    cVar2 = *t;
    if (cVar2 == '\0') {
      cVar2 = '\0';
    }
    else if (cVar2 < '\x01') {
      cVar2 = -(char)((uint)-(int)cVar2 / uVar1);
    }
    else {
      cVar2 = (char)((uint)(int)cVar2 / uVar1);
    }
    *result = cVar2;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if( u == 0 )
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        // Test for t > 0
        // If t < 0, must explicitly upcast, or implicit upcast to ulong will cause errors
        // As it turns out, 32-bit division is about twice as fast, which justifies the extra conditional

        if( t > 0 )
            result = (T)( t/u );
        else
            result = (T)( (std::int64_t)t/(std::int64_t)u );
    }